

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::setFileName(TSMuxer *this,string *fileName,FileFactory *fileFactory)

{
  string local_b0;
  undefined1 local_90 [8];
  string ext;
  string local_60;
  string local_40;
  FileFactory *local_20;
  FileFactory *fileFactory_local;
  string *fileName_local;
  TSMuxer *this_local;
  
  this->m_curFileNum = 0;
  local_20 = fileFactory;
  fileFactory_local = (FileFactory *)fileName;
  fileName_local = (string *)this;
  AbstractMuxer::setFileName(&this->super_AbstractMuxer,fileName,fileFactory);
  std::__cxx11::string::string((string *)&local_60,(string *)fileFactory_local);
  getNextName(&local_40,this,&local_60);
  std::__cxx11::string::operator=((string *)&this->m_outFileName,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  extractFileExt(&local_b0,&this->m_outFileName);
  strToUpperCase((string *)local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  setMuxFormat(this,(string *)local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->m_fileNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_fileNames,&this->m_outFileName);
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void TSMuxer::setFileName(const std::string& fileName, FileFactory* fileFactory)
{
    m_curFileNum = 0;
    AbstractMuxer::setFileName(fileName, fileFactory);
    m_outFileName = getNextName(fileName);
    const string ext = strToUpperCase(extractFileExt(m_outFileName));
    setMuxFormat(ext);

    m_fileNames.clear();
    m_fileNames.push_back(m_outFileName);
}